

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfont.cpp
# Opt level: O2

QString * __thiscall QFont::defaultFamily(QString *__return_storage_ptr__,QFont *this)

{
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_58;
  QArrayDataPointer<QString> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_38.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.size = 0;
  local_58.d = (Data *)0x0;
  local_58.ptr = (char16_t *)0x0;
  qt_fallbacksForFamily
            ((QStringList *)&local_38,(QString *)&local_58,StyleNormal,
             (uint)(byte)(((this->d).d.ptr)->request).field_0x64,Script_Common);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  if ((undefined1 *)local_38.size == (undefined1 *)0x0) {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    QArrayDataPointer<char16_t>::QArrayDataPointer(&__return_storage_ptr__->d,&(local_38.ptr)->d);
  }
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QFont::defaultFamily() const
{
    const QStringList fallbacks = qt_fallbacksForFamily(QString(),
                                                        QFont::StyleNormal,
                                                        QFont::StyleHint(d->request.styleHint),
                                                        QFontDatabasePrivate::Script_Common);
    if (!fallbacks.isEmpty())
        return fallbacks.first();
    return QString();
}